

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot.cpp
# Opt level: O0

bool ImPlot::DragPoint(char *id,double *x,double *y,bool show_label,ImVec4 *col,float radius)

{
  double dVar1;
  ImPlotContext *pIVar2;
  bool bVar3;
  ImU32 col_00;
  ImU32 fg;
  ImDrawList *this;
  ImGuiWindow *pIVar4;
  float fVar5;
  ImPlotPoint IVar6;
  ImVec4 *local_168;
  bool dragging;
  char local_128 [8];
  char buff2 [32];
  char buff1 [32];
  ImVec2 local_dc;
  ImVec2 local_d4;
  ImVec2 label_pos;
  ImVec2 local_c4;
  ImVec2 local_bc;
  ImVec2 local_b4;
  ImVec2 new_cursor_pos;
  ImVec2 old_cursor_pos;
  int yax;
  ImVec2 pos;
  ImDrawList *DrawList;
  undefined1 auStack_88 [4];
  ImU32 col32;
  ImVec4 color;
  bool outside;
  float grab_size;
  ImPlotContext *gp;
  float radius_local;
  ImVec4 *col_local;
  bool show_label_local;
  double *y_local;
  double *x_local;
  char *id_local;
  
  pIVar2 = GImPlot;
  if (GImPlot->CurrentPlot != (ImPlotPlot *)0x0) {
    fVar5 = ImMax<float>(5.0,radius * 2.0);
    GetPlotLimits((ImPlotLimits *)&color.z,-1);
    bVar3 = ImPlotLimits::Contains((ImPlotLimits *)&color.z,*x,*y);
    if (((bVar3 ^ 0xffU) & 1) == 0) {
      bVar3 = IsColorAuto(col);
      local_168 = col;
      if (bVar3) {
        local_168 = ImGui::GetStyleColorVec4(0);
      }
      auStack_88 = local_168->x;
      unique0x1000045f = local_168->y;
      color.x = local_168->z;
      color.y = local_168->w;
      col_00 = ImGui::ColorConvertFloat4ToU32((ImVec4 *)auStack_88);
      this = GetPlotDrawList();
      unique0x10000219 = PlotToPixels(*x,*y,-1);
      old_cursor_pos.x = (float)GetCurrentYAxis();
      new_cursor_pos = ImGui::GetCursorScreenPos();
      ImVec2::ImVec2(&local_c4,fVar5,fVar5);
      local_bc = ::operator*(&local_c4,0.5);
      local_b4 = operator-((ImVec2 *)&old_cursor_pos.y,&local_bc);
      pIVar4 = ImGui::GetCurrentWindow();
      (pIVar4->DC).CursorPos = local_b4;
      ImVec2::ImVec2(&label_pos,fVar5,fVar5);
      ImGui::InvisibleButton(id,&label_pos,0);
      pIVar4 = ImGui::GetCurrentWindow();
      (pIVar4->DC).CursorPos = new_cursor_pos;
      PushPlotClipRect(0.0);
      bVar3 = ImGui::IsItemHovered(0);
      if ((bVar3) || (bVar3 = ImGui::IsItemActive(), bVar3)) {
        ImDrawList::AddCircleFilled(this,(ImVec2 *)&old_cursor_pos.y,radius * 1.5,col_00,0);
        pIVar2->CurrentPlot->PlotHovered = false;
        if (show_label) {
          fVar5 = (GImGui->Style).MouseCursorScale;
          ImVec2::ImVec2(&local_dc,fVar5 * 16.0,fVar5 * 8.0);
          local_d4 = ::operator+((ImVec2 *)&old_cursor_pos.y,&local_dc);
          LabelAxisValue(&pIVar2->CurrentPlot->XAxis,&pIVar2->XTicks,*x,buff2 + 0x18,0x20);
          LabelAxisValue(pIVar2->CurrentPlot->YAxis + (int)old_cursor_pos.x,
                         pIVar2->YTicks + (int)old_cursor_pos.x,*y,local_128,0x20);
          ImVec2::ImVec2((ImVec2 *)&stack0xfffffffffffffed0,0.0001,1e-05);
          fg = CalcTextColor((ImVec4 *)auStack_88);
          ImPlotAnnotationCollection::Append
                    (&pIVar2->Annotations,&local_d4,(ImVec2 *)&stack0xfffffffffffffed0,col_00,fg,
                     true,"%s = %s,%s",id,buff2 + 0x18,local_128);
        }
      }
      else {
        ImDrawList::AddCircleFilled(this,(ImVec2 *)&old_cursor_pos.y,radius,col_00,0);
      }
      PopPlotClipRect();
      id_local._7_1_ = false;
      bVar3 = ImGui::IsItemActive();
      if ((bVar3) && (bVar3 = ImGui::IsMouseDragging(0,-1.0), bVar3)) {
        IVar6 = GetPlotMousePos(-1);
        *x = IVar6.x;
        IVar6 = GetPlotMousePos(-1);
        *y = IVar6.y;
        dVar1 = ImClamp<double>(*x,(pIVar2->CurrentPlot->XAxis).Range.Min,
                                (pIVar2->CurrentPlot->XAxis).Range.Max);
        *x = dVar1;
        dVar1 = ImClamp<double>(*y,pIVar2->CurrentPlot->YAxis[(int)old_cursor_pos.x].Range.Min,
                                pIVar2->CurrentPlot->YAxis[(int)old_cursor_pos.x].Range.Max);
        *y = dVar1;
        id_local._7_1_ = true;
      }
    }
    else {
      id_local._7_1_ = false;
    }
    return id_local._7_1_;
  }
  __assert_fail("(gp.CurrentPlot != __null) && \"DragPoint() needs to be called between BeginPlot() and EndPlot()!\""
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/implot.cpp"
                ,0xb71,
                "bool ImPlot::DragPoint(const char *, double *, double *, bool, const ImVec4 &, float)"
               );
}

Assistant:

bool DragPoint(const char* id, double* x, double* y, bool show_label, const ImVec4& col, float radius) {
    ImPlotContext& gp = *GImPlot;
    IM_ASSERT_USER_ERROR(gp.CurrentPlot != NULL, "DragPoint() needs to be called between BeginPlot() and EndPlot()!");
    const float grab_size = ImMax(5.0f, 2*radius);
    const bool outside = !GetPlotLimits().Contains(*x,*y);
    if (outside)
        return false;
    const ImVec4 color = IsColorAuto(col) ? ImGui::GetStyleColorVec4(ImGuiCol_Text) : col;
    const ImU32 col32 = ImGui::ColorConvertFloat4ToU32(color);
    ImDrawList& DrawList = *GetPlotDrawList();
    const ImVec2 pos = PlotToPixels(*x,*y);
    int yax = GetCurrentYAxis();
    ImVec2 old_cursor_pos = ImGui::GetCursorScreenPos();
    ImVec2 new_cursor_pos = ImVec2(pos - ImVec2(grab_size,grab_size)*0.5f);
    ImGui::GetCurrentWindow()->DC.CursorPos = new_cursor_pos;
    ImGui::InvisibleButton(id, ImVec2(grab_size, grab_size));
    ImGui::GetCurrentWindow()->DC.CursorPos = old_cursor_pos;
    PushPlotClipRect();
    if (ImGui::IsItemHovered() || ImGui::IsItemActive()) {
        DrawList.AddCircleFilled(pos, 1.5f*radius, (col32));
        gp.CurrentPlot->PlotHovered = false;
        if (show_label) {
            ImVec2 label_pos = pos + ImVec2(16 * GImGui->Style.MouseCursorScale, 8 * GImGui->Style.MouseCursorScale);
            char buff1[32];
            char buff2[32];
            LabelAxisValue(gp.CurrentPlot->XAxis, gp.XTicks, *x, buff1, 32);
            LabelAxisValue(gp.CurrentPlot->YAxis[yax], gp.YTicks[yax], *y, buff2, 32);
            gp.Annotations.Append(label_pos, ImVec2(0.0001f,0.00001f), col32, CalcTextColor(color), true, "%s = %s,%s", id, buff1, buff2);
        }
    }
    else {
        DrawList.AddCircleFilled(pos, radius, col32);
    }
    PopPlotClipRect();


    bool dragging = false;
    if (ImGui::IsItemActive() && ImGui::IsMouseDragging(0)) {
        *x = ImPlot::GetPlotMousePos().x;
        *y = ImPlot::GetPlotMousePos().y;
        *x = ImClamp(*x, gp.CurrentPlot->XAxis.Range.Min, gp.CurrentPlot->XAxis.Range.Max);
        *y = ImClamp(*y, gp.CurrentPlot->YAxis[yax].Range.Min, gp.CurrentPlot->YAxis[yax].Range.Max);
        dragging = true;
    }
    return dragging;
}